

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_widgets.cpp
# Opt level: O2

void ImGui::TableSaveSettings(ImGuiTable *table)

{
  byte bVar1;
  uint uVar2;
  ImGuiTableColumn *pIVar3;
  ImGuiContext *pIVar4;
  int iVar5;
  ImGuiTableSettings *p;
  ImS8 *pIVar6;
  bool bVar7;
  ImGuiTableSettings *pIVar8;
  int iVar9;
  byte bVar10;
  float fVar11;
  
  table->IsSettingsDirty = false;
  pIVar4 = GImGui;
  if ((table->Flags & 0x20) != 0) {
    return;
  }
  p = TableGetBoundSettings(table);
  if (p == (ImGuiTableSettings *)0x0) {
    p = TableSettingsCreate(table->ID,table->ColumnsCount);
    iVar5 = ImChunkStream<ImGuiTableSettings>::offset_from_ptr(&pIVar4->SettingsTables,p);
    table->SettingsOffset = iVar5;
  }
  iVar5 = table->ColumnsCount;
  p->ColumnsCount = (char)iVar5;
  if (p->ID == table->ID) {
    if (((char)iVar5 == iVar5) && (iVar5 <= p->ColumnsCountMax)) {
      pIVar3 = (table->Columns).Data;
      p->SaveFlags = 0;
      pIVar8 = p + 1;
      pIVar6 = &pIVar3->SortDirection;
      bVar7 = false;
      for (iVar9 = 0; iVar9 < iVar5; iVar9 = iVar9 + 1) {
        fVar11 = *(float *)(pIVar6 + (ulong)((*(ImGuiTableColumnFlags *)(pIVar6 + -0x48) & 4) == 0)
                                     * 8 + -0x38);
        pIVar8->ID = (ImGuiID)fVar11;
        *(char *)&pIVar8->RefScale = (char)iVar9;
        *(ImS8 *)((long)&pIVar8->RefScale + 1) = pIVar6[-5];
        *(ImS8 *)((long)&pIVar8->RefScale + 2) = pIVar6[-1];
        bVar10 = *pIVar6;
        bVar1 = *(byte *)((long)&pIVar8->RefScale + 3);
        *(byte *)((long)&pIVar8->RefScale + 3) = bVar1 & 0xfc | bVar10 & 3;
        bVar10 = bVar1 & 0xf8 | bVar10 & 3 | pIVar6[-10] << 2;
        *(byte *)((long)&pIVar8->RefScale + 3) = bVar10;
        *(byte *)((long)&pIVar8->RefScale + 3) =
             bVar10 & 0xf7 | (byte)*(ImGuiTableColumnFlags *)(pIVar6 + -0x48) * '\x02' & 8;
        uVar2 = *(uint *)(pIVar6 + -0x48);
        if ((fVar11 != *(float *)(pIVar6 + -0x3c)) ||
           (NAN(fVar11) || NAN(*(float *)(pIVar6 + -0x3c)))) {
          *(byte *)&p->SaveFlags = (byte)p->SaveFlags | 1;
        }
        if (iVar9 != pIVar6[-5]) {
          *(byte *)&p->SaveFlags = (byte)p->SaveFlags | 2;
        }
        if (pIVar6[-1] != 0xff) {
          *(byte *)&p->SaveFlags = (byte)p->SaveFlags | 8;
        }
        if ((uVar2 & 1) == (uint)(byte)pIVar6[-10]) {
          *(byte *)&p->SaveFlags = (byte)p->SaveFlags | 4;
        }
        bVar7 = (bool)(bVar7 | (uVar2 & 4) == 0);
        pIVar8 = (ImGuiTableSettings *)&pIVar8->ColumnsCount;
        iVar5 = table->ColumnsCount;
        pIVar6 = pIVar6 + 0x68;
      }
      p->SaveFlags = p->SaveFlags & table->Flags;
      fVar11 = 0.0;
      if (bVar7) {
        fVar11 = table->RefScale;
      }
      p->RefScale = fVar11;
      MarkIniSettingsDirty();
      return;
    }
    __assert_fail("settings->ColumnsCount == table->ColumnsCount && settings->ColumnsCountMax >= settings->ColumnsCount"
                  ,
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/JoelLinn[P]py-mahi-gui/thirdparty/mahi-gui/3rdparty/imgui/imgui_widgets.cpp"
                  ,0x2b95,"void ImGui::TableSaveSettings(ImGuiTable *)");
  }
  __assert_fail("settings->ID == table->ID",
                "/workspace/llm4binary/github/license_all_cmakelists_1510/JoelLinn[P]py-mahi-gui/thirdparty/mahi-gui/3rdparty/imgui/imgui_widgets.cpp"
                ,0x2b94,"void ImGui::TableSaveSettings(ImGuiTable *)");
}

Assistant:

void ImGui::TableSaveSettings(ImGuiTable* table)
{
    table->IsSettingsDirty = false;
    if (table->Flags & ImGuiTableFlags_NoSavedSettings)
        return;

    // Bind or create settings data
    ImGuiContext& g = *GImGui;
    ImGuiTableSettings* settings = TableGetBoundSettings(table);
    if (settings == NULL)
    {
        settings = TableSettingsCreate(table->ID, table->ColumnsCount);
        table->SettingsOffset = g.SettingsTables.offset_from_ptr(settings);
    }
    settings->ColumnsCount = (ImS8)table->ColumnsCount;

    // Serialize ImGuiTable/ImGuiTableColumn into ImGuiTableSettings/ImGuiTableColumnSettings
    IM_ASSERT(settings->ID == table->ID);
    IM_ASSERT(settings->ColumnsCount == table->ColumnsCount && settings->ColumnsCountMax >= settings->ColumnsCount);
    ImGuiTableColumn* column = table->Columns.Data;
    ImGuiTableColumnSettings* column_settings = settings->GetColumnSettings();

    bool save_ref_scale = false;
    settings->SaveFlags = ImGuiTableFlags_None;
    for (int n = 0; n < table->ColumnsCount; n++, column++, column_settings++)
    {
        const float width_or_weight = (column->Flags & ImGuiTableColumnFlags_WidthStretch) ? column->StretchWeight : column->WidthRequest;
        column_settings->WidthOrWeight = width_or_weight;
        column_settings->Index = (ImS8)n;
        column_settings->DisplayOrder = column->DisplayOrder;
        column_settings->SortOrder = column->SortOrder;
        column_settings->SortDirection = column->SortDirection;
        column_settings->IsVisible = column->IsVisible;
        column_settings->IsStretch = (column->Flags & ImGuiTableColumnFlags_WidthStretch) ? 1 : 0;
        if ((column->Flags & ImGuiTableColumnFlags_WidthStretch) == 0)
            save_ref_scale = true;

        // We skip saving some data in the .ini file when they are unnecessary to restore our state.
        // Note that fixed width where initial width was derived from auto-fit will always be saved as InitStretchWeightOrWidth will be 0.0f.
        // FIXME-TABLE: We don't have logic to easily compare SortOrder to DefaultSortOrder yet so it's always saved when present.
        if (width_or_weight != column->InitStretchWeightOrWidth)
            settings->SaveFlags |= ImGuiTableFlags_Resizable;
        if (column->DisplayOrder != n)
            settings->SaveFlags |= ImGuiTableFlags_Reorderable;
        if (column->SortOrder != -1)
            settings->SaveFlags |= ImGuiTableFlags_Sortable;
        if (column->IsVisible != ((column->Flags & ImGuiTableColumnFlags_DefaultHide) == 0))
            settings->SaveFlags |= ImGuiTableFlags_Hideable;
    }
    settings->SaveFlags &= table->Flags;
    settings->RefScale = save_ref_scale ? table->RefScale : 0.0f;

    MarkIniSettingsDirty();
}